

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

json_string * __thiscall
JSONWorker::toUTF8_abi_cxx11_(json_string *__return_storage_ptr__,JSONWorker *this,uchar p)

{
  char cVar1;
  byte local_26;
  byte local_25;
  uchar lo;
  uchar hi;
  allocator local_13;
  undefined1 local_12;
  byte local_11;
  json_string *pjStack_10;
  uchar p_local;
  json_string *res;
  
  local_11 = (byte)this;
  local_12 = 0;
  pjStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\\u",&local_13);
  std::allocator<char>::~allocator((allocator<char> *)&local_13);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"00");
  cVar1 = (char)((int)(uint)local_11 >> 4);
  local_25 = cVar1 + 0x30;
  if (0x39 < local_25) {
    local_25 = cVar1 + 0x37;
  }
  local_26 = (local_11 & 0xf) + 0x30;
  if (0x39 < local_26) {
    local_26 = (local_11 & 0xf) + 0x37;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_25);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_26);
  return __return_storage_ptr__;
}

Assistant:

json_string JSONWorker::toUTF8(json_uchar p) json_nothrow {
	   #ifdef JSON_UNICODE
		  if (json_unlikely(p > 0xFFFF)) return toSurrogatePair(p);
	   #endif
	   json_string res(JSON_TEXT("\\u"));
	   #ifdef JSON_UNICODE
		  START_MEM_SCOPE
			 json_uchar hihi = ((p & 0xF000) >> 12) + 48;
			 if (hihi > 57) hihi += 7; //A-F don't immediately follow 0-9, so have to further adjust those
			 json_uchar hilo = ((p & 0x0F00) >> 8) + 48;
			 if (hilo > 57) hilo += 7; //A-F don't immediately follow 0-9, so have to further adjust those
			 res += hihi;
			 res += hilo;
		  END_MEM_SCOPE
		  json_uchar hi = ((p & 0x00F0) >> 4) + 48;
	   #else
		  res += JSON_TEXT("00");
		  json_uchar hi = (p >> 4) + 48;
	   #endif
	   //convert the character to be escaped into two digits between 0 and 15
	   if (hi > 57) hi += 7; //A-F don't immediately follow 0-9, so have to further adjust those
	   json_uchar lo = (p & 0x000F) + 48;
	   if (lo > 57) lo += 7; //A-F don't immediately follow 0-9, so have to further adjust those
	   res += hi;
	   res += lo;
	   return res;
    }